

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_locale.cpp
# Opt level: O2

wchar_t * __thiscall
ON_Locale::GetAppleLocaleName(ON_Locale *this,wchar_t *buffer,size_t buffer_capacity)

{
  char *cbuffer_00;
  wchar_t *pwVar1;
  char cbuffer [128];
  char acStack_98 [136];
  
  cbuffer_00 = GetAppleLocaleName(this,acStack_98,0x80);
  pwVar1 = LocalWideStringBuider(cbuffer_00,buffer,buffer_capacity);
  return pwVar1;
}

Assistant:

const wchar_t* ON_Locale::GetAppleLocaleName(
  wchar_t* buffer,
  size_t buffer_capacity
  ) const
{
  char cbuffer[ON_Locale::BUFFER_MAXIMUM_CAPACITY];
  return (LocalWideStringBuider(
    GetAppleLocaleName(cbuffer,sizeof(cbuffer)/sizeof(cbuffer[0])),
    buffer,
    buffer_capacity
    ));
}